

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plt-elf.c
# Opt level: O2

void * lib_dt_lookup(plt_lib lib,ElfSWord tag)

{
  void *pvVar1;
  anon_union_8_2_f9000a74_for_d_un *paVar2;
  
  paVar2 = &lib->l_ld->d_un;
  while( true ) {
    if (((Elf64_Dyn *)(paVar2 + -1))->d_tag == 0) {
      return (void *)0x0;
    }
    if (((Elf64_Dyn *)(paVar2 + -1))->d_tag == tag) break;
    paVar2 = paVar2 + 2;
  }
  pvVar1 = (void *)paVar2->d_val;
  if ((char)((ulong)pvVar1 >> 0x38) != -1 && (void *)lib->l_addr <= pvVar1) {
    return pvVar1;
  }
  return (void *)((long)pvVar1 + (long)lib->l_addr);
}

Assistant:

static void *lib_dt_lookup(plt_lib lib, ElfSWord tag)
{
    ElfW(Addr) base =(ElfW(Addr)) lib->l_addr;
    for (const ElfW(Dyn) *dyn = lib->l_ld; dyn->d_tag != DT_NULL; ++dyn) {
        if (dyn->d_tag == tag) {
            if (dyn->d_un.d_ptr >= base
                    && (dyn->d_un.d_ptr >> (MMK_BITS - 8)) ^ 0xff)
                return (void*) dyn->d_un.d_ptr;
            else
                return (char*) base + dyn->d_un.d_ptr;
        }
    }
    return NULL;
}